

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_user.cpp
# Opt level: O0

void P_PlayerThink(player_t *player)

{
  float fVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  int iVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  uint uVar28;
  uint uVar29;
  int iVar30;
  undefined4 uVar31;
  undefined4 uVar32;
  undefined4 uVar33;
  undefined4 uVar34;
  undefined4 uVar35;
  undefined4 uVar36;
  undefined4 uVar37;
  long lVar38;
  ticcmd_t *ptVar39;
  short sVar40;
  FILE *__stream;
  char cVar41;
  short sVar42;
  uint uVar43;
  int iVar44;
  DWORD DVar45;
  FWeaponSlot *pFVar46;
  AActor *pAVar47;
  FMusicMap *this;
  char *musicname;
  bool bVar48;
  double dVar49;
  double dVar50;
  double dVar51;
  undefined8 in_stack_fffffffffffffe58;
  undefined4 uVar52;
  TAngle<double> local_f0;
  FName local_e4;
  TFlags<ActorFlag2,_unsigned_int> local_e0;
  int local_dc;
  int maxhealth;
  FName local_cc;
  FSoundID local_c8;
  FSoundID local_c4;
  int local_c0;
  FName local_bc;
  int id;
  AInventory *fly;
  Self local_a8;
  TFlags<ActorFlag,_unsigned_int> local_a4;
  FSoundID local_a0;
  Self local_9c;
  double local_98;
  double jumpvelz;
  TAngle<double> local_88;
  TAngle<double> local_80;
  TAngle<double> local_78;
  TAngle<double> local_70;
  TAngle<double> local_68;
  int local_5c;
  FName *pFStack_58;
  int clook;
  FName *music;
  byte local_45;
  int crouchdir;
  bool totallyfrozen;
  Self local_3c;
  TFlags<ActorFlag,_unsigned_int> local_38;
  TFlags<ActorFlag2,_unsigned_int> local_34;
  Self local_30;
  TFlags<ActorFlag,_unsigned_int> local_2c;
  float local_28;
  float local_24;
  float zoom;
  float desired;
  ticcmd_t *cmd;
  player_t *player_local;
  
  uVar52 = (undefined4)((ulong)in_stack_fffffffffffffe58 >> 0x20);
  cmd = (ticcmd_t *)player;
  if (player->mo == (APlayerPawn *)0x0) {
    pFVar46 = player[-0xa3fb].weapons.Slots + 4;
    I_Error("No player %td start\n",(long)pFVar46 / 0x2a0 + 1,(long)pFVar46 % 0x2a0);
  }
  iVar44 = gametic;
  __stream = debugfile;
  if ((debugfile != (FILE *)0x0) &&
     (uVar43._0_2_ = cmd[0xb].ucmd.sidemove, uVar43._2_2_ = cmd[0xb].ucmd.upmove,
     (uVar43 & 0x2000) == 0)) {
    ptVar39 = cmd + -0x1585a4;
    dVar49 = AActor::X(*(AActor **)&cmd->ucmd);
    dVar50 = AActor::Y(*(AActor **)&cmd->ucmd);
    dVar51 = AActor::Z(*(AActor **)&cmd->ucmd);
    uVar2._0_2_ = (cmd->ucmd).sidemove;
    uVar2._2_2_ = (cmd->ucmd).upmove;
    fprintf((FILE *)__stream,"tic %d for pl %d: (%f, %f, %f, %f) b:%02x p:%d y:%d f:%d s:%d u:%d\n",
            dVar49,dVar50,SUB84(dVar51,0),*(undefined8 *)(*(long *)&cmd->ucmd + 0xb0),
            (ulong)(uint)iVar44,(long)&ptVar39->consistancy / 0x2a0 & 0xffffffff,(ulong)uVar2,
            (ulong)(uint)(int)cmd->consistancy,CONCAT44(uVar52,(int)*(short *)&cmd->field_0x12),
            (int)*(short *)((long)&cmd[1].ucmd.buttons + 2),(int)cmd[1].ucmd.pitch,
            (int)cmd[1].ucmd.yaw);
  }
  local_24 = *(float *)&cmd[4].ucmd.roll;
  if ((((char)(cmd->ucmd).roll != '\x01') &&
      (lVar38._0_2_ = cmd[10].ucmd.roll, lVar38._2_2_ = cmd[10].ucmd.forwardmove,
      lVar38._4_2_ = cmd[10].ucmd.sidemove, lVar38._6_2_ = cmd[10].ucmd.upmove, lVar38 != 0)) &&
     ((fVar1 = *(float *)(*(long *)&cmd[10].ucmd.roll + 0x598), fVar1 != 0.0 || (NAN(fVar1))))) {
    local_24 = ABS(*(float *)(*(long *)&cmd[10].ucmd.roll + 0x598)) * local_24;
  }
  fVar1 = *(float *)&cmd[4].ucmd.sidemove;
  if ((fVar1 != local_24) || (NAN(fVar1) || NAN(local_24))) {
    if (7.0 <= ABS(*(float *)&cmd[4].ucmd.sidemove - local_24)) {
      local_28 = MAX<float>(7.0,ABS(*(float *)&cmd[4].ucmd.sidemove - local_24) * 0.025);
      if (*(float *)&cmd[4].ucmd.sidemove <= local_24) {
        *(float *)&cmd[4].ucmd.sidemove = *(float *)&cmd[4].ucmd.sidemove + local_28;
      }
      else {
        *(float *)&cmd[4].ucmd.sidemove = *(float *)&cmd[4].ucmd.sidemove - local_28;
      }
    }
    else {
      *(float *)&cmd[4].ucmd.sidemove = local_24;
    }
  }
  if (*(int *)&cmd[7].consistancy != 0) {
    *(int *)&cmd[7].consistancy = *(int *)&cmd[7].consistancy + -1;
  }
  uVar3._0_2_ = cmd[0xb].ucmd.sidemove;
  uVar3._2_2_ = cmd[0xb].ucmd.upmove;
  cmd[0xb].ucmd.sidemove = (short)(uVar3 & 0xffffbfff);
  cmd[0xb].ucmd.upmove = (short)((uVar3 & 0xffffbfff) >> 0x10);
  uVar4._0_2_ = cmd[0xb].ucmd.sidemove;
  uVar4._2_2_ = cmd[0xb].ucmd.upmove;
  if ((uVar4 & 0x40000001) == 0x40000000) {
    uVar5._0_2_ = cmd[0xb].ucmd.sidemove;
    uVar5._2_2_ = cmd[0xb].ucmd.upmove;
    cmd[0xb].ucmd.sidemove = (short)(uVar5 & 0xbfffffff);
    cmd[0xb].ucmd.upmove = (short)((uVar5 & 0xbfffffff) >> 0x10);
  }
  uVar6._0_2_ = cmd[0xb].ucmd.sidemove;
  uVar6._2_2_ = cmd[0xb].ucmd.upmove;
  bVar48 = true;
  if ((uVar6 & 0x40000001) == 0) {
    pAVar47 = AActor::GetDefault(*(AActor **)&cmd->ucmd);
    TFlags<ActorFlag,_unsigned_int>::operator&
              (&local_2c,
               (int)pAVar47 +
               (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|MF_SHOOTABLE));
    uVar43 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_2c);
    bVar48 = uVar43 != 0;
  }
  if (bVar48) {
    TFlags<ActorFlag,_unsigned_int>::operator|=
              ((TFlags<ActorFlag,_unsigned_int> *)(*(long *)&cmd->ucmd + 0x1bc),MF_NOCLIP);
  }
  else {
    operator~((EnumType)&local_30);
    TFlags<ActorFlag,_unsigned_int>::operator&=
              ((TFlags<ActorFlag,_unsigned_int> *)(*(long *)&cmd->ucmd + 0x1bc),&local_30);
  }
  uVar7._0_2_ = cmd[0xb].ucmd.sidemove;
  uVar7._2_2_ = cmd[0xb].ucmd.upmove;
  if ((uVar7 & 0x40000000) == 0) {
    uVar31 = (cmd->ucmd).buttons;
    TFlags<ActorFlag2,_unsigned_int>::operator&
              (&local_34,uVar31 + (MF2_RIP|MF2_NOTELEPORT|MF2_SPAWNFLOAT));
    uVar43 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_34);
    bVar48 = false;
    if (uVar43 == 0) {
      pAVar47 = AActor::GetDefault(*(AActor **)&cmd->ucmd);
      TFlags<ActorFlag,_unsigned_int>::operator&
                (&local_38,
                 (int)pAVar47 +
                 (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|MF_SHOOTABLE))
      ;
      uVar43 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_38);
      bVar48 = uVar43 == 0;
    }
    if (bVar48) {
      operator~((EnumType)&local_3c);
      TFlags<ActorFlag,_unsigned_int>::operator&=
                ((TFlags<ActorFlag,_unsigned_int> *)(*(long *)&cmd->ucmd + 0x1bc),&local_3c);
    }
  }
  else {
    TFlags<ActorFlag,_unsigned_int>::operator|=
              ((TFlags<ActorFlag,_unsigned_int> *)(*(long *)&cmd->ucmd + 0x1bc),MF_NOGRAVITY);
  }
  _zoom = &(cmd->ucmd).sidemove;
  sVar42 = cmd[1].ucmd.upmove;
  cmd[2].ucmd.roll = cmd[1].ucmd.sidemove;
  cmd[2].ucmd.forwardmove = sVar42;
  *(undefined8 *)&cmd[1].ucmd.sidemove = *(undefined8 *)_zoom;
  sVar42 = cmd[1].ucmd.pitch;
  sVar40 = cmd[1].ucmd.yaw;
  cmd[2].ucmd.buttons = cmd[1].ucmd.buttons;
  cmd[2].ucmd.pitch = sVar42;
  cmd[2].ucmd.yaw = sVar40;
  uVar32 = (cmd->ucmd).buttons;
  TFlags<ActorFlag,_unsigned_int>::operator&
            ((TFlags<ActorFlag,_unsigned_int> *)&stack0xffffffffffffffc0,
             uVar32 + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|
                      MF_SHOOTABLE));
  uVar43 = TFlags::operator_cast_to_unsigned_int((TFlags *)&stack0xffffffffffffffc0);
  if (uVar43 != 0) {
    _zoom[3] = 0;
    _zoom[5] = 0x6400;
    _zoom[6] = 0;
    operator~((EnumType)&crouchdir);
    TFlags<ActorFlag,_unsigned_int>::operator&=
              ((TFlags<ActorFlag,_unsigned_int> *)(*(long *)&cmd->ucmd + 0x1bc),(Self *)&crouchdir);
  }
  local_45 = P_IsPlayerTotallyFrozen((player_t *)cmd);
  if ((bool)local_45) {
    if (gamestate == GS_TITLELEVEL) {
      *(uint *)_zoom = 0;
    }
    else {
      *(uint *)_zoom = *(uint *)_zoom & 2;
    }
    _zoom[2] = 0;
    _zoom[3] = 0;
    _zoom[4] = 0;
    _zoom[5] = 0;
    _zoom[6] = 0;
    _zoom[7] = 0;
    *(undefined1 *)((long)&cmd[7].ucmd.pitch + 1) = 0;
  }
  else {
    uVar8._0_2_ = cmd[0xb].ucmd.sidemove;
    uVar8._2_2_ = cmd[0xb].ucmd.upmove;
    if ((uVar8 & 0x40) != 0) {
      _zoom[5] = 0;
      _zoom[6] = 0;
      _zoom[7] = 0;
    }
  }
  uVar9._0_2_ = (cmd->ucmd).sidemove;
  uVar9._2_2_ = (cmd->ucmd).upmove;
  if ((uVar9 & 4) != 0) {
    uVar10._0_2_ = (cmd->ucmd).sidemove;
    uVar10._2_2_ = (cmd->ucmd).upmove;
    (cmd->ucmd).sidemove = (short)(uVar10 & 0xfffffff7);
    (cmd->ucmd).upmove = (short)((uVar10 & 0xfffffff7) >> 0x10);
  }
  bVar48 = player_t::CanCrouch((player_t *)cmd);
  if (((bVar48) &&
      (iVar44._0_2_ = cmd[7].ucmd.sidemove, iVar44._2_2_ = cmd[7].ucmd.upmove, 0 < iVar44)) &&
     (bVar48 = FLevelLocals::IsCrouchingAllowed(&level), bVar48)) {
    if ((local_45 & 1) == 0) {
      music._4_4_ = (int)*(char *)((long)&cmd[0x14].ucmd.buttons + 2);
      if (music._4_4_ == 0) {
        uVar11._0_2_ = (cmd->ucmd).sidemove;
        uVar11._2_2_ = (cmd->ucmd).upmove;
        music._4_4_ = 1;
        if ((uVar11 & 8) != 0) {
          music._4_4_ = -1;
        }
      }
      else {
        uVar12._0_2_ = (cmd->ucmd).sidemove;
        uVar12._2_2_ = (cmd->ucmd).upmove;
        if ((uVar12 & 8) != 0) {
          *(undefined1 *)((long)&cmd[0x14].ucmd.buttons + 2) = 0;
        }
      }
      if (((music._4_4_ != 1) ||
          (1.0 < *(double *)&cmd[0x16].consistancy || *(double *)&cmd[0x16].consistancy == 1.0)) ||
         (dVar49 = AActor::Top(*(AActor **)&cmd->ucmd),
         *(double *)(*(long *)&cmd->ucmd + 0x148) <= dVar49)) {
        if ((music._4_4_ == -1) && (0.5 < *(double *)&cmd[0x16].consistancy)) {
          P_CrouchMove((player_t *)cmd,-1);
        }
      }
      else {
        P_CrouchMove((player_t *)cmd,1);
      }
    }
  }
  else {
    player_t::Uncrouch((player_t *)cmd);
  }
  *(double *)&cmd[0x17].ucmd.pitch =
       -*(double *)(*(long *)&cmd->ucmd + 0x500) * (1.0 - *(double *)&cmd[0x16].consistancy);
  if (((-1 < (char)cmd[0x14].ucmd.buttons) &&
      (bVar48 = TObjPtr<AActor>::operator!=
                          ((TObjPtr<AActor> *)&cmd[0x13].ucmd.sidemove,(AActor *)0x0), bVar48)) &&
     (cVar41 = (char)cmd[0x14].ucmd.buttons + -1, *(char *)&cmd[0x14].ucmd.buttons = cVar41,
     cVar41 < '\0')) {
    if ((long)&cmd[-0x1585a4].consistancy / 0x2a0 == (long)consoleplayer) {
      pAVar47 = TObjPtr<AActor>::operator->((TObjPtr<AActor> *)&cmd[0x13].ucmd.sidemove);
      if (pAVar47->args[0] == 0) {
        S_ChangeMusic("*",0,true,false);
      }
      else {
        this = &(level.info)->MusicMap;
        pAVar47 = TObjPtr<AActor>::operator->((TObjPtr<AActor> *)&cmd[0x13].ucmd.sidemove);
        pFStack_58 = TMap<int,_FName,_THashTraits<int>,_TValueTraits<FName>_>::CheckKey
                               (this,pAVar47->args[0]);
        if (pFStack_58 != (FName *)0x0) {
          musicname = FName::GetChars(pFStack_58);
          pAVar47 = TObjPtr<AActor>::operator->((TObjPtr<AActor> *)&cmd[0x13].ucmd.sidemove);
          S_ChangeMusic(musicname,pAVar47->args[1],true,false);
        }
      }
    }
    ptVar39 = cmd + -0x1585a4;
    pAVar47 = TObjPtr<AActor>::operator->((TObjPtr<AActor> *)&cmd[0x13].ucmd.sidemove);
    DPrintf(3,"MUSINFO change for player %d to %d\n",
            (long)&ptVar39->consistancy / 0x2a0 & 0xffffffff,(ulong)(uint)pAVar47->args[0]);
  }
  if ((char)(cmd->ucmd).roll == '\x01') {
    player_t::Uncrouch((player_t *)cmd);
    P_DeathThink((player_t *)cmd);
  }
  else {
    iVar13._0_2_ = cmd[0x12].ucmd.pitch;
    iVar13._2_2_ = cmd[0x12].ucmd.yaw;
    if (((iVar13 != 0) &&
        (*(int *)&cmd[0x12].ucmd.pitch = *(int *)&cmd[0x12].ucmd.pitch + -1,
        (cmd[0x12].ucmd.roll & 1) != 0)) &&
       (iVar14._0_2_ = cmd[0x12].ucmd.pitch, iVar14._2_2_ = cmd[0x12].ucmd.yaw, iVar14 < -0x12)) {
      cmd[0x12].ucmd.pitch = 0;
      cmd[0x12].ucmd.yaw = 0;
    }
    if ((cmd[0x10].ucmd.buttons != 0) &&
       (uVar15._0_2_ = cmd[0xb].ucmd.sidemove, uVar15._2_2_ = cmd[0xb].ucmd.upmove,
       (uVar15 & 0x2000) == 0)) {
      APlayerPawn::MorphPlayerThink(*(APlayerPawn **)&cmd->ucmd);
    }
    bVar48 = FLevelLocals::IsFreelookAllowed(&level);
    if (bVar48) {
      local_5c = (int)(short)*(uint *)(_zoom + 2);
      if (local_5c != 0) {
        if (local_5c == -0x8000) {
          *(undefined1 *)&cmd[7].ucmd.pitch = 1;
        }
        else if ((cmd[7].ucmd.pitch & 1) == 0) {
          TAngle<double>::operator-(&local_70,(double)local_5c * 0.0054931640625);
          TAngle<double>::TAngle(&local_78,(TAngle<double> *)(cmd + 0x16));
          TAngle<double>::TAngle(&local_80,(TAngle<double> *)&cmd[0x16].ucmd.roll);
          clamp<TAngle<double>>(&local_68,&local_70,&local_78);
          TAngle<double>::operator=((TAngle<double> *)(*(long *)&cmd->ucmd + 0xa8),&local_68);
        }
      }
    }
    else {
      TAngle<double>::operator=((TAngle<double> *)(*(long *)&cmd->ucmd + 0xa8),0.0);
    }
    if ((cmd[7].ucmd.pitch & 1) != 0) {
      fabs<double>(&local_88);
      bVar48 = TAngle<double>::operator>(&local_88,2.0);
      if (bVar48) {
        TAngle<double>::operator*=
                  ((TAngle<double> *)(*(long *)&cmd->ucmd + 0xa8),0.6666666666666666);
      }
      else {
        TAngle<double>::operator=((TAngle<double> *)(*(long *)&cmd->ucmd + 0xa8),0.0);
        *(undefined1 *)&cmd[7].ucmd.pitch = 0;
        if ((long)&cmd[-0x1585a4].consistancy / 0x2a0 == (long)consoleplayer) {
          LocalViewPitch = 0;
        }
      }
    }
    if (((*(uint *)_zoom & 0x10) != 0) &&
       (uVar16._0_2_ = cmd[7].ucmd.roll, uVar16._2_2_ = cmd[7].ucmd.forwardmove,
       (uVar16 & 0x10) == 0)) {
      *(undefined1 *)((long)&cmd[7].ucmd.pitch + 1) = 9;
    }
    if (*(int *)(*(long *)&cmd->ucmd + 0x220) == 0) {
      P_MovePlayer((player_t *)cmd);
      if ((*(uint *)_zoom & 4) != 0) {
        dVar49 = *(double *)&cmd[0x17].ucmd.pitch;
        if ((dVar49 != 0.0) || (NAN(dVar49))) {
          *(undefined1 *)((long)&cmd[0x14].ucmd.buttons + 2) = 1;
        }
        else if (*(int *)(*(long *)&cmd->ucmd + 0x2d0) < 2) {
          uVar33 = (cmd->ucmd).buttons;
          TFlags<ActorFlag,_unsigned_int>::operator&
                    ((TFlags<ActorFlag,_unsigned_int> *)((long)&jumpvelz + 4),
                     uVar33 + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|
                              MF_SHOOTABLE));
          uVar43 = TFlags::operator_cast_to_unsigned_int((TFlags *)((long)&jumpvelz + 4));
          if (uVar43 == 0) {
            bVar48 = FLevelLocals::IsJumpingAllowed(&level);
            if (((bVar48) && ((cmd[0x12].ucmd.roll & 1) != 0)) &&
               (iVar17._0_2_ = cmd[0x12].ucmd.pitch, iVar17._2_2_ = cmd[0x12].ucmd.yaw, iVar17 == 0)
               ) {
              local_98 = (*(double *)(*(long *)&cmd->ucmd + 0x4e0) * 35.0) / 35.0;
              uVar18._0_2_ = cmd[0xb].ucmd.sidemove;
              uVar18._2_2_ = cmd[0xb].ucmd.upmove;
              if ((uVar18 & 0x40000) != 0) {
                local_98 = local_98 * 2.0;
              }
              *(double *)(*(long *)&cmd->ucmd + 0xd8) =
                   local_98 + *(double *)(*(long *)&cmd->ucmd + 0xd8);
              operator~((EnumType)&local_9c);
              TFlags<ActorFlag2,_unsigned_int>::operator&=
                        ((TFlags<ActorFlag2,_unsigned_int> *)(*(long *)&cmd->ucmd + 0x1c0),&local_9c
                        );
              cmd[0x12].ucmd.pitch = -1;
              cmd[0x12].ucmd.yaw = -1;
              uVar19._0_2_ = cmd[0xb].ucmd.sidemove;
              uVar19._2_2_ = cmd[0xb].ucmd.upmove;
              if ((uVar19 & 0x2000) == 0) {
                pAVar47 = *(AActor **)&cmd->ucmd;
                FSoundID::FSoundID(&local_a0,"*jump");
                S_Sound(pAVar47,4,&local_a0,1.0,1.0);
              }
            }
          }
          else {
            *(undefined8 *)(*(long *)&cmd->ucmd + 0xd8) = 0x4008000000000000;
          }
        }
        else {
          *(double *)(*(long *)&cmd->ucmd + 0xd8) = *(double *)(*(long *)&cmd->ucmd + 0xe0) * 4.0;
        }
      }
      if (_zoom[7] == -0x8000) {
        uVar34 = (cmd->ucmd).buttons;
        TFlags<ActorFlag,_unsigned_int>::operator&
                  (&local_a4,
                   uVar34 + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|
                            MF_SHOOTABLE));
        uVar43 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_a4);
        bVar48 = false;
        if (uVar43 != 0) {
          bVar48 = *(int *)(*(long *)&cmd->ucmd + 0x2d0) < 2;
        }
        if (bVar48) {
          operator~((EnumType)&local_a8);
          TFlags<ActorFlag,_unsigned_int>::operator&=
                    ((TFlags<ActorFlag,_unsigned_int> *)(*(long *)&cmd->ucmd + 0x1bc),&local_a8);
        }
      }
      else if (_zoom[7] != 0) {
        sVar42 = clamp<short>(_zoom[7],-0x300,0x300);
        _zoom[7] = sVar42;
        bVar48 = true;
        if (*(int *)(*(long *)&cmd->ucmd + 0x2d0) < 2) {
          uVar35 = (cmd->ucmd).buttons;
          TFlags<ActorFlag2,_unsigned_int>::operator&
                    ((TFlags<ActorFlag2,_unsigned_int> *)((long)&fly + 4),
                     uVar35 + (MF2_RIP|MF2_NOTELEPORT|MF2_SPAWNFLOAT));
          uVar43 = TFlags::operator_cast_to_unsigned_int((TFlags *)((long)&fly + 4));
          bVar48 = true;
          if (uVar43 == 0) {
            uVar20._0_2_ = cmd[0xb].ucmd.sidemove;
            uVar20._2_2_ = cmd[0xb].ucmd.upmove;
            bVar48 = (uVar20 & 0x40000000) != 0;
          }
        }
        if (bVar48) {
          *(double *)(*(long *)&cmd->ucmd + 0xd8) =
               (*(double *)(*(long *)&cmd->ucmd + 0xe0) * (double)(int)_zoom[7]) / 128.0;
          bVar48 = false;
          if (*(int *)(*(long *)&cmd->ucmd + 0x2d0) < 2) {
            uVar36 = (cmd->ucmd).buttons;
            TFlags<ActorFlag,_unsigned_int>::operator&
                      ((TFlags<ActorFlag,_unsigned_int> *)&fly,
                       uVar36 + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR
                                |MF_SHOOTABLE));
            uVar43 = TFlags::operator_cast_to_unsigned_int((TFlags *)&fly);
            bVar48 = uVar43 == 0;
          }
          if (bVar48) {
            TFlags<ActorFlag2,_unsigned_int>::operator|=
                      ((TFlags<ActorFlag2,_unsigned_int> *)(*(long *)&cmd->ucmd + 0x1c0),MF2_FLY);
            TFlags<ActorFlag,_unsigned_int>::operator|=
                      ((TFlags<ActorFlag,_unsigned_int> *)(*(long *)&cmd->ucmd + 0x1bc),MF_NOGRAVITY
                      );
            if ((*(double *)(*(long *)&cmd->ucmd + 0xd8) <= -39.0) &&
               (uVar21._0_2_ = cmd[0xb].ucmd.sidemove, uVar21._2_2_ = cmd[0xb].ucmd.upmove,
               (uVar21 & 0x2000) == 0)) {
              S_StopSound(*(AActor **)&cmd->ucmd,2);
            }
          }
        }
        else if ((0 < _zoom[7]) &&
                (uVar22._0_2_ = cmd[0xb].ucmd.sidemove, uVar22._2_2_ = cmd[0xb].ucmd.upmove,
                (uVar22 & 0x2000) == 0)) {
          pAVar47 = *(AActor **)&cmd->ucmd;
          FName::FName(&local_bc,NAME_ArtiFly);
          _id = AActor::FindInventory(pAVar47,&local_bc);
          if (_id != (AInventory *)0x0) {
            (**(code **)(**(long **)&cmd->ucmd + 0xb8))(*(long **)&cmd->ucmd,_id);
          }
        }
      }
    }
    else {
      *(int *)(*(long *)&cmd->ucmd + 0x220) = *(int *)(*(long *)&cmd->ucmd + 0x220) + -1;
    }
    P_CalcHeight((player_t *)cmd);
    uVar23._0_2_ = cmd[0xb].ucmd.sidemove;
    uVar23._2_2_ = cmd[0xb].ucmd.upmove;
    if ((uVar23 & 0x2000) == 0) {
      P_PlayerOnSpecial3DFloor((player_t *)cmd);
      P_PlayerInSpecialSector((player_t *)cmd,(sector_t *)0x0);
      pAVar47 = *(AActor **)&cmd->ucmd;
      dVar49 = secplane_t::ZatPoint
                         ((secplane_t *)(*(long *)(*(long *)&cmd->ucmd + 0x130) + 0xb0),
                          *(AActor **)&cmd->ucmd);
      bVar48 = AActor::isAbove(pAVar47,dVar49);
      ptVar39 = cmd;
      if ((!bVar48) || (*(int *)(*(long *)&cmd->ucmd + 0x2d0) != 0)) {
        iVar44 = P_GetThingFloorType(*(AActor **)&cmd->ucmd);
        P_PlayerOnSpecialFlat((player_t *)ptVar39,iVar44);
      }
      if ((((*(double *)(*(long *)&cmd->ucmd + 0xd8) <= -*(double *)(*(long *)&cmd->ucmd + 0x4f0))
           && (-*(double *)(*(long *)&cmd->ucmd + 0x4f8) <= *(double *)(*(long *)&cmd->ucmd + 0xd8))
           ) && (cmd[0x10].ucmd.buttons == 0)) && (*(int *)(*(long *)&cmd->ucmd + 0x2d0) == 0)) {
        pAVar47 = *(AActor **)&cmd->ucmd;
        FSoundID::FSoundID(&local_c4,"*falling");
        local_c0 = S_FindSkinnedSound(pAVar47,&local_c4);
        if ((local_c0 != 0) &&
           (bVar48 = S_IsActorPlayingSomething(*(AActor **)&cmd->ucmd,2,local_c0), !bVar48)) {
          pAVar47 = *(AActor **)&cmd->ucmd;
          FSoundID::FSoundID(&local_c8,local_c0);
          S_Sound(pAVar47,2,&local_c8,1.0,1.0);
        }
      }
      if ((*(uint *)_zoom & 2) == 0) {
        *(undefined1 *)((long)&cmd[7].ucmd.yaw + 1) = 0;
      }
      else if ((cmd[7].ucmd.yaw & 0x100) == 0) {
        *(undefined1 *)((long)&cmd[7].ucmd.yaw + 1) = 1;
        bVar48 = P_TalkFacing(*(AActor **)&cmd->ucmd);
        if (!bVar48) {
          P_UseLines((player_t *)cmd);
        }
      }
      if (cmd[0x10].ucmd.buttons != 0) {
        if (cmd[0x12].ucmd.buttons != 0) {
          cmd[0x12].ucmd.buttons = cmd[0x12].ucmd.buttons - 3;
        }
        DVar45 = cmd[0x10].ucmd.buttons - 1;
        cmd[0x10].ucmd.buttons = DVar45;
        if (DVar45 == 0) {
          P_UndoPlayerMorph((player_t *)cmd,(player_t *)cmd,0x1000,false);
        }
      }
      player_t::TickPSprites((player_t *)cmd);
      if (cmd[0xd].ucmd.buttons != 0) {
        cmd[0xd].ucmd.buttons = cmd[0xd].ucmd.buttons - 1;
      }
      iVar24._0_2_ = cmd[0xd].ucmd.pitch;
      iVar24._2_2_ = cmd[0xd].ucmd.yaw;
      if (iVar24 != 0) {
        *(int *)&cmd[0xd].ucmd.pitch = *(int *)&cmd[0xd].ucmd.pitch + -1;
      }
      iVar25._0_2_ = cmd[0xd].ucmd.roll;
      iVar25._2_2_ = cmd[0xd].ucmd.forwardmove;
      if (((iVar25 != 0) &&
          (*(int *)&cmd[0xd].ucmd.roll = *(int *)&cmd[0xd].ucmd.roll + -1,
          level.time % *(int *)&cmd[0xd].ucmd.sidemove == 0)) &&
         (iVar26._0_2_ = cmd[0xd].ucmd.roll, iVar26._2_2_ = cmd[0xd].ucmd.forwardmove,
         0x230 < iVar26)) {
        pAVar47 = *(AActor **)&cmd->ucmd;
        FName::FName(&local_cc,(FName *)&cmd[0xd].consistancy);
        TAngle<double>::TAngle((TAngle<double> *)&stack0xffffffffffffff28,0.0);
        P_DamageMobj(pAVar47,(AActor *)0x0,(AActor *)0x0,5,&local_cc,0,
                     (DAngle *)&stack0xffffffffffffff28);
      }
      ptVar39 = cmd;
      if ((cmd[0xe].ucmd.buttons != 0) && ((level.time & 0xfU) == 0)) {
        cmd[0xe].ucmd.buttons = cmd[0xe].ucmd.buttons - 5;
        if ((int)cmd[0xe].ucmd.buttons < 0) {
          cmd[0xe].ucmd.buttons = 0;
        }
        pAVar47 = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&cmd[0xe].consistancy);
        P_PoisonDamage((player_t *)ptVar39,pAVar47,1,true);
      }
      uVar43 = FIntCVar::operator_cast_to_int(&dmflags2);
      if ((uVar43 & 0x80) != 0) {
        local_dc = APlayerPawn::GetMaxHealth(*(APlayerPawn **)&cmd->ucmd);
        local_dc = local_dc + *(int *)(*(long *)&cmd->ucmd + 0x2b0);
        if ((level.time % 0x23 == 0) &&
           (iVar27._0_2_ = cmd[7].ucmd.sidemove, iVar27._2_2_ = cmd[7].ucmd.upmove,
           local_dc < iVar27)) {
          if (*(int *)&cmd[7].ucmd.sidemove + -5 < local_dc) {
            *(int *)&cmd[7].ucmd.sidemove = local_dc;
          }
          else {
            *(int *)&cmd[7].ucmd.sidemove = *(int *)&cmd[7].ucmd.sidemove + -1;
          }
          *(undefined4 *)(*(long *)&cmd->ucmd + 0x1fc) = *(undefined4 *)&cmd[7].ucmd.sidemove;
        }
      }
      bVar48 = true;
      if (2 < *(int *)(*(long *)&cmd->ucmd + 0x2d0)) {
        uVar37 = (cmd->ucmd).buttons;
        TFlags<ActorFlag2,_unsigned_int>::operator&
                  (&local_e0,uVar37 + (MF2_RIP|MF2_NOTELEPORT|MF2_SPAWNFLOAT));
        uVar43 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_e0);
        bVar48 = true;
        if ((uVar43 == 0) &&
           (uVar28._0_2_ = cmd[0xb].ucmd.sidemove, uVar28._2_2_ = cmd[0xb].ucmd.upmove,
           bVar48 = true, (uVar28 & 0x40000002) == 0)) {
          uVar29._0_2_ = cmd[0xb].ucmd.sidemove;
          uVar29._2_2_ = cmd[0xb].ucmd.upmove;
          bVar48 = (uVar29 & 0x2000000) != 0;
        }
      }
      if (bVar48) {
        APlayerPawn::ResetAirSupply(*(APlayerPawn **)&cmd->ucmd,true);
      }
      else {
        iVar30._0_2_ = cmd[0x13].ucmd.pitch;
        iVar30._2_2_ = cmd[0x13].ucmd.yaw;
        if ((iVar30 <= level.time) && ((level.time & 0x1fU) == 0)) {
          pAVar47 = *(AActor **)&cmd->ucmd;
          iVar44 = level.time - *(int *)&cmd[0x13].ucmd.pitch;
          FName::FName(&local_e4,NAME_Drowning);
          TAngle<double>::TAngle(&local_f0,0.0);
          P_DamageMobj(pAVar47,(AActor *)0x0,(AActor *)0x0,iVar44 / 0x23 + 2,&local_e4,0,&local_f0);
        }
      }
    }
  }
  return;
}

Assistant:

void P_PlayerThink (player_t *player)
{
	ticcmd_t *cmd;

	if (player->mo == NULL)
	{
		I_Error ("No player %td start\n", player - players + 1);
	}

	if (debugfile && !(player->cheats & CF_PREDICTING))
	{
		fprintf (debugfile, "tic %d for pl %d: (%f, %f, %f, %f) b:%02x p:%d y:%d f:%d s:%d u:%d\n",
			gametic, (int)(player-players), player->mo->X(), player->mo->Y(), player->mo->Z(),
			player->mo->Angles.Yaw.Degrees, player->cmd.ucmd.buttons,
			player->cmd.ucmd.pitch, player->cmd.ucmd.yaw, player->cmd.ucmd.forwardmove,
			player->cmd.ucmd.sidemove, player->cmd.ucmd.upmove);
	}

	// [RH] Zoom the player's FOV
	float desired = player->DesiredFOV;
	// Adjust FOV using on the currently held weapon.
	if (player->playerstate != PST_DEAD &&		// No adjustment while dead.
		player->ReadyWeapon != NULL &&			// No adjustment if no weapon.
		player->ReadyWeapon->FOVScale != 0)		// No adjustment if the adjustment is zero.
	{
		// A negative scale is used to prevent G_AddViewAngle/G_AddViewPitch
		// from scaling with the FOV scale.
		desired *= fabsf(player->ReadyWeapon->FOVScale);
	}
	if (player->FOV != desired)
	{
		if (fabsf (player->FOV - desired) < 7.f)
		{
			player->FOV = desired;
		}
		else
		{
			float zoom = MAX(7.f, fabsf(player->FOV - desired) * 0.025f);
			if (player->FOV > desired)
			{
				player->FOV = player->FOV - zoom;
			}
			else
			{
				player->FOV = player->FOV + zoom;
			}
		}
	}
	if (player->inventorytics)
	{
		player->inventorytics--;
	}
	// Don't interpolate the view for more than one tic
	player->cheats &= ~CF_INTERPVIEW;

	// No-clip cheat
	if ((player->cheats & (CF_NOCLIP | CF_NOCLIP2)) == CF_NOCLIP2)
	{ // No noclip2 without noclip
		player->cheats &= ~CF_NOCLIP2;
	}
	if (player->cheats & (CF_NOCLIP | CF_NOCLIP2) || (player->mo->GetDefault()->flags & MF_NOCLIP))
	{
		player->mo->flags |= MF_NOCLIP;
	}
	else
	{
		player->mo->flags &= ~MF_NOCLIP;
	}
	if (player->cheats & CF_NOCLIP2)
	{
		player->mo->flags |= MF_NOGRAVITY;
	}
	else if (!(player->mo->flags2 & MF2_FLY) && !(player->mo->GetDefault()->flags & MF_NOGRAVITY))
	{
		player->mo->flags &= ~MF_NOGRAVITY;
	}
	cmd = &player->cmd;

	// Make unmodified copies for ACS's GetPlayerInput.
	player->original_oldbuttons = player->original_cmd.buttons;
	player->original_cmd = cmd->ucmd;

	if (player->mo->flags & MF_JUSTATTACKED)
	{ // Chainsaw/Gauntlets attack auto forward motion
		cmd->ucmd.yaw = 0;
		cmd->ucmd.forwardmove = 0xc800/2;
		cmd->ucmd.sidemove = 0;
		player->mo->flags &= ~MF_JUSTATTACKED;
	}

	bool totallyfrozen = P_IsPlayerTotallyFrozen(player);

	// [RH] Being totally frozen zeros out most input parameters.
	if (totallyfrozen)
	{
		if (gamestate == GS_TITLELEVEL)
		{
			cmd->ucmd.buttons = 0;
		}
		else
		{
			cmd->ucmd.buttons &= BT_USE;
		}
		cmd->ucmd.pitch = 0;
		cmd->ucmd.yaw = 0;
		cmd->ucmd.roll = 0;
		cmd->ucmd.forwardmove = 0;
		cmd->ucmd.sidemove = 0;
		cmd->ucmd.upmove = 0;
		player->turnticks = 0;
	}
	else if (player->cheats & CF_FROZEN)
	{
		cmd->ucmd.forwardmove = 0;
		cmd->ucmd.sidemove = 0;
		cmd->ucmd.upmove = 0;
	}

	// Handle crouching
	if (player->cmd.ucmd.buttons & BT_JUMP)
	{
		player->cmd.ucmd.buttons &= ~BT_CROUCH;
	}
	if (player->CanCrouch() && player->health > 0 && level.IsCrouchingAllowed())
	{
		if (!totallyfrozen)
		{
			int crouchdir = player->crouching;
		
			if (crouchdir == 0)
			{
				crouchdir = (player->cmd.ucmd.buttons & BT_CROUCH) ? -1 : 1;
			}
			else if (player->cmd.ucmd.buttons & BT_CROUCH)
			{
				player->crouching = 0;
			}
			if (crouchdir == 1 && player->crouchfactor < 1 &&
				player->mo->Top() < player->mo->ceilingz)
			{
				P_CrouchMove(player, 1);
			}
			else if (crouchdir == -1 && player->crouchfactor > 0.5)
			{
				P_CrouchMove(player, -1);
			}
		}
	}
	else
	{
		player->Uncrouch();
	}

	player->crouchoffset = -(player->mo->ViewHeight) * (1 - player->crouchfactor);

	// MUSINFO stuff
	if (player->MUSINFOtics >= 0 && player->MUSINFOactor != NULL)
	{
		if (--player->MUSINFOtics < 0)
		{
			if (player - players == consoleplayer)
			{
				if (player->MUSINFOactor->args[0] != 0)
				{
					FName *music = level.info->MusicMap.CheckKey(player->MUSINFOactor->args[0]);

					if (music != NULL)
					{
						S_ChangeMusic(music->GetChars(), player->MUSINFOactor->args[1]);
					}
				}
				else
				{
					S_ChangeMusic("*");
				}
			}
			DPrintf(DMSG_NOTIFY, "MUSINFO change for player %d to %d\n", (int)(player - players), player->MUSINFOactor->args[0]);
		}
	}

	if (player->playerstate == PST_DEAD)
	{
		player->Uncrouch();
		P_DeathThink (player);
		return;
	}
	if (player->jumpTics != 0)
	{
		player->jumpTics--;
		if (player->onground && player->jumpTics < -18)
		{
			player->jumpTics = 0;
		}
	}
	if (player->morphTics && !(player->cheats & CF_PREDICTING))
	{
		player->mo->MorphPlayerThink ();
	}

	// [RH] Look up/down stuff
	if (!level.IsFreelookAllowed())
	{
		player->mo->Angles.Pitch = 0.;
	}
	else
	{
		// The player's view pitch is clamped between -32 and +56 degrees,
		// which translates to about half a screen height up and (more than)
		// one full screen height down from straight ahead when view panning
		// is used.
		int clook = cmd->ucmd.pitch;
		if (clook != 0)
		{
			if (clook == -32768)
			{ // center view
				player->centering = true;
			}
			else if (!player->centering)
			{
				// no more overflows with floating point. Yay! :)
				player->mo->Angles.Pitch = clamp(player->mo->Angles.Pitch - clook * (360. / 65536.), player->MinPitch, player->MaxPitch);
			}
		}
	}
	if (player->centering)
	{
		if (fabs(player->mo->Angles.Pitch) > 2.)
		{
			player->mo->Angles.Pitch *= (2. / 3.);
		}
		else
		{
			player->mo->Angles.Pitch = 0.;
			player->centering = false;
			if (player - players == consoleplayer)
			{
				LocalViewPitch = 0;
			}
		}
	}

	// [RH] Check for fast turn around
	if (cmd->ucmd.buttons & BT_TURN180 && !(player->oldbuttons & BT_TURN180))
	{
		player->turnticks = TURN180_TICKS;
	}

	// Handle movement
	if (player->mo->reactiontime)
	{ // Player is frozen
		player->mo->reactiontime--;
	}
	else
	{
		P_MovePlayer (player);

		// [RH] check for jump
		if (cmd->ucmd.buttons & BT_JUMP)
		{
			if (player->crouchoffset != 0)
			{
				// Jumping while crouching will force an un-crouch but not jump
				player->crouching = 1;
			}
			else if (player->mo->waterlevel >= 2)
			{
				player->mo->Vel.Z = 4 * player->mo->Speed;
			}
			else if (player->mo->flags & MF_NOGRAVITY)
			{
				player->mo->Vel.Z = 3.;
			}
			else if (level.IsJumpingAllowed() && player->onground && player->jumpTics == 0)
			{
				double jumpvelz = player->mo->JumpZ * 35 / TICRATE;

				// [BC] If the player has the high jump power, double his jump velocity.
				if ( player->cheats & CF_HIGHJUMP )	jumpvelz *= 2;

				player->mo->Vel.Z += jumpvelz;
				player->mo->flags2 &= ~MF2_ONMOBJ;
				player->jumpTics = -1;
				if (!(player->cheats & CF_PREDICTING))
					S_Sound(player->mo, CHAN_BODY, "*jump", 1, ATTN_NORM);
			}
		}

		if (cmd->ucmd.upmove == -32768)
		{ // Only land if in the air
			if ((player->mo->flags & MF_NOGRAVITY) && player->mo->waterlevel < 2)
			{
				//player->mo->flags2 &= ~MF2_FLY;
				player->mo->flags &= ~MF_NOGRAVITY;
			}
		}
		else if (cmd->ucmd.upmove != 0)
		{
			// Clamp the speed to some reasonable maximum.
			cmd->ucmd.upmove = clamp<short>(cmd->ucmd.upmove, -0x300, 0x300);
			if (player->mo->waterlevel >= 2 || (player->mo->flags2 & MF2_FLY) || (player->cheats & CF_NOCLIP2))
			{
				player->mo->Vel.Z = player->mo->Speed * cmd->ucmd.upmove / 128.;
				if (player->mo->waterlevel < 2 && !(player->mo->flags & MF_NOGRAVITY))
				{
					player->mo->flags2 |= MF2_FLY;
					player->mo->flags |= MF_NOGRAVITY;
					if ((player->mo->Vel.Z <= -39) && !(player->cheats & CF_PREDICTING))
					{ // Stop falling scream
						S_StopSound (player->mo, CHAN_VOICE);
					}
				}
			}
			else if (cmd->ucmd.upmove > 0 && !(player->cheats & CF_PREDICTING))
			{
				AInventory *fly = player->mo->FindInventory (NAME_ArtiFly);
				if (fly != NULL)
				{
					player->mo->UseInventory (fly);
				}
			}
		}
	}

	P_CalcHeight (player);

	if (!(player->cheats & CF_PREDICTING))
	{
		P_PlayerOnSpecial3DFloor (player);
		P_PlayerInSpecialSector (player);

		if (!player->mo->isAbove(player->mo->Sector->floorplane.ZatPoint(player->mo)) ||
			player->mo->waterlevel)
		{
			// Player must be touching the floor
			P_PlayerOnSpecialFlat(player, P_GetThingFloorType(player->mo));
		}
		if (player->mo->Vel.Z <= -player->mo->FallingScreamMinSpeed &&
			player->mo->Vel.Z >= -player->mo->FallingScreamMaxSpeed && !player->morphTics &&
			player->mo->waterlevel == 0)
		{
			int id = S_FindSkinnedSound (player->mo, "*falling");
			if (id != 0 && !S_IsActorPlayingSomething (player->mo, CHAN_VOICE, id))
			{
				S_Sound (player->mo, CHAN_VOICE, id, 1, ATTN_NORM);
			}
		}
		// check for use
		if (cmd->ucmd.buttons & BT_USE)
		{
			if (!player->usedown)
			{
				player->usedown = true;
				if (!P_TalkFacing(player->mo))
				{
					P_UseLines(player);
				}
			}
		}
		else
		{
			player->usedown = false;
		}
		// Morph counter
		if (player->morphTics)
		{
			if (player->chickenPeck)
			{ // Chicken attack counter
				player->chickenPeck -= 3;
			}
			if (!--player->morphTics)
			{ // Attempt to undo the chicken/pig
				P_UndoPlayerMorph (player, player, MORPH_UNDOBYTIMEOUT);
			}
		}
		// Cycle psprites
		player->TickPSprites();

		// Other Counters
		if (player->damagecount)
			player->damagecount--;

		if (player->bonuscount)
			player->bonuscount--;

		if (player->hazardcount)
		{
			player->hazardcount--;
			if (!(level.time % player->hazardinterval) && player->hazardcount > 16*TICRATE)
				P_DamageMobj (player->mo, NULL, NULL, 5, player->hazardtype);
		}

		if (player->poisoncount && !(level.time & 15))
		{
			player->poisoncount -= 5;
			if (player->poisoncount < 0)
			{
				player->poisoncount = 0;
			}
			P_PoisonDamage (player, player->poisoner, 1, true);
		}

		// Apply degeneration.
		if (dmflags2 & DF2_YES_DEGENERATION)
		{
			int maxhealth = player->mo->GetMaxHealth() + player->mo->stamina;
			if ((level.time % TICRATE) == 0 && player->health > maxhealth)
			{
				if (player->health - 5 < maxhealth)
					player->health = maxhealth;
				else
					player->health--;

				player->mo->health = player->health;
			}
		}

		// Handle air supply
		//if (level.airsupply > 0)
		{
			if (player->mo->waterlevel < 3 ||
				(player->mo->flags2 & MF2_INVULNERABLE) ||
				(player->cheats & (CF_GODMODE | CF_NOCLIP2)) ||
				(player->cheats & CF_GODMODE2))
			{
				player->mo->ResetAirSupply ();
			}
			else if (player->air_finished <= level.time && !(level.time & 31))
			{
				P_DamageMobj (player->mo, NULL, NULL, 2 + ((level.time-player->air_finished)/TICRATE), NAME_Drowning);
			}
		}
	}
}